

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O2

Position * __thiscall
iDynTree::Position::operator-(Position *__return_storage_ptr__,Position *this,Position *other)

{
  Position local_30;
  
  inverse(&local_30,other);
  compose(__return_storage_ptr__,this,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Position Position::operator-(const Position& other) const
    {
        return compose(*this,inverse(other));
    }